

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.cpp
# Opt level: O1

BarcodeMatrix * __thiscall
ZXing::Pdf417::Encoder::generateBarcodeLogic
          (BarcodeMatrix *__return_storage_ptr__,Encoder *this,wstring *msg,int errorCorrectionLevel
          )

{
  bool bVar1;
  short sVar2;
  short *psVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  void *pvVar7;
  bool bVar8;
  Encoder *pEVar9;
  long lVar10;
  invalid_argument *piVar11;
  int iVar12;
  undefined4 in_register_0000000c;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  CharacterSet in_R8B;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong unaff_R13;
  uint uVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  vector<int,_std::allocator<int>_> dataCodewords;
  int n;
  vector<int,_std::allocator<int>_> e;
  vector<int,_std::allocator<int>_> highLevel;
  vector<int,_std::allocator<int>_> local_d8;
  ulong local_b8;
  ulong local_b0;
  int local_a4;
  ulong local_a0;
  Encoder *local_98;
  ulong local_90;
  pointer local_88;
  ulong local_80;
  vector<int,_std::allocator<int>_> local_78;
  ulong local_60;
  vector<int,_std::allocator<int>_> local_58;
  long local_40;
  undefined8 local_38;
  ulong __n;
  
  local_90 = CONCAT44(in_register_0000000c,errorCorrectionLevel);
  if (8 < (uint)errorCorrectionLevel) {
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar11,"Error correction level must be between 0 and 8!");
    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar19 = 2 << ((byte)errorCorrectionLevel & 0x1f);
  __n = (ulong)uVar19;
  HighLevelEncoder::EncodeHighLevel
            (&local_58,(HighLevelEncoder *)msg,(wstring *)(ulong)this->_compaction,
             (uint)this->_encoding,in_R8B);
  uVar16 = this->_minCols;
  uVar23 = this->_minRows;
  uVar4 = (uint)((ulong)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  local_b0 = __n;
  local_98 = this;
  if ((int)uVar16 <= this->_maxCols) {
    iVar12 = uVar4 + uVar19 + 1;
    local_b8 = (ulong)(uVar16 * 0x10);
    iVar17 = uVar16 * 0x11 + 0x45;
    fVar24 = 0.0;
    bVar1 = false;
    uVar22 = uVar16;
    do {
      uVar5 = iVar12 / (int)uVar22;
      uVar20 = uVar5 + 1;
      if ((int)(iVar12 + uVar22) <= (int)(uVar20 * uVar22)) {
        uVar20 = uVar5;
      }
      bVar8 = true;
      if (((int)uVar23 <= (int)uVar20) && (bVar8 = false, (int)uVar20 <= this->_maxRows)) {
        fVar25 = (float)(iVar17 / (int)uVar20) * 0.25;
        if ((!bVar1) || (ABS(fVar25 + -3.0) <= ABS(fVar24 + -3.0))) {
          bVar1 = true;
          bVar8 = false;
          local_b8 = (ulong)uVar20;
          unaff_R13 = (ulong)uVar22;
          fVar24 = fVar25;
        }
      }
      if (bVar8) break;
      uVar22 = uVar22 + 1;
      iVar17 = iVar17 + 0x11;
    } while (this->_maxCols + 1U != uVar22);
    uVar13 = local_b8;
    if (bVar1) goto LAB_0017bd9d;
  }
  iVar12 = (int)(uVar4 + uVar19 + 1) / (int)uVar16;
  iVar17 = iVar12 + 1;
  if ((int)(uVar4 + uVar19 + uVar16 + 1) <= (int)(iVar17 * uVar16)) {
    iVar17 = iVar12;
  }
  unaff_R13 = (ulong)uVar16;
  uVar13 = (ulong)uVar23;
  if ((int)uVar23 <= iVar17) {
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar11,"Unable to fit message in columns");
    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
LAB_0017bd9d:
  iVar17 = (int)unaff_R13 * (int)uVar13 - uVar19;
  iVar12 = 0;
  if ((int)(uVar4 + 1) < iVar17) {
    iVar12 = ~uVar4 + iVar17;
  }
  local_b8 = uVar13;
  local_80 = unaff_R13;
  if ((int)(uVar19 + uVar4) < 0x3a1) {
    local_a4 = uVar4 + iVar12 + 1;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    std::vector<int,_std::allocator<int>_>::reserve(&local_d8,(long)local_a4);
    if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_d8,
                 (iterator)
                 local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_a4);
    }
    else {
      *local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_a4;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((vector<int,std::allocator<int>> *)&local_d8,
               local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    if (0 < iVar12) {
      iVar17 = 0;
      do {
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 900;
        if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_d8,
                     (iterator)
                     local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_78);
        }
        else {
          *local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 900;
          local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 < iVar12);
    }
    local_38 = (pointer)((ulong)local_38._4_4_ << 0x20);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_78,__n,(value_type_conflict3 *)&local_38,(allocator_type *)&local_40);
    uVar13 = local_b8;
    local_88 = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_a0 = (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    uVar16 = (uint)(local_a0 >> 2);
    if (0 < (int)uVar16) {
      puVar6 = (uint *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
      psVar3 = *(short **)(EC_COEFFICIENTS + (local_90 & 0xffffffff) * 8);
      sVar2 = *psVar3;
      uVar18 = 0;
      uVar14 = __n;
      do {
        iVar12 = (int)(puVar6[__n - 1] +
                      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar18]) % 0x3a1;
        uVar14 = uVar14 & 0xffffffff;
        uVar21 = (ulong)(uVar19 - 1);
        do {
          iVar17 = psVar3[uVar21] * iVar12;
          puVar6[uVar21] =
               (int)(((iVar17 / 0x3a1) * 0x3a1 - iVar17) + puVar6[uVar21 - 1] + 0x3a1) % 0x3a1;
          uVar21 = uVar21 - 1;
          uVar23 = (int)uVar14 - 1;
          uVar14 = (ulong)uVar23;
        } while (1 < (int)uVar23);
        iVar12 = iVar12 * sVar2;
        *puVar6 = (((iVar12 / 0x3a1) * 0x3a1 - iVar12) + 0x3a1U) % 0x3a1;
        uVar18 = uVar18 + 1;
        uVar14 = local_b0;
      } while (uVar18 != (uVar16 & 0x7fffffff));
    }
    local_40 = CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_);
    uVar14 = 0;
    do {
      iVar12 = *(int *)(local_40 + uVar14 * 4);
      if (iVar12 != 0) {
        *(int *)(local_40 + uVar14 * 4) = 0x3a1 - iVar12;
      }
      uVar14 = uVar14 + 1;
    } while (__n != uVar14);
    local_38 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::vector<int,std::allocator<int>>::
    _M_range_insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
              ((vector<int,std::allocator<int>> *)&local_d8,
               (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + local_a0);
    pEVar9 = local_98;
    pvVar7 = (void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,(long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pvVar7);
    }
    bVar1 = pEVar9->_compact;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->_matrix).
             super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->_matrix).
             super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    (__return_storage_ptr__->_matrix).
    super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->_matrix).
    super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->_currentRow = -1;
    BarcodeMatrix::init(__return_storage_ptr__,(EVP_PKEY_CTX *)(uVar13 & 0xffffffff));
    if (0 < (int)uVar13) {
      iVar12 = (int)uVar13 + -1;
      local_b0 = (ulong)(uint)(iVar12 / 3);
      local_60 = (ulong)(uint)(iVar12 % 3 + (int)local_90 * 3);
      iVar12 = (int)local_80;
      local_98 = (Encoder *)CONCAT44(local_98._4_4_,iVar12 + -1);
      uVar16 = 0;
      local_a0 = local_a0 & 0xffffffff00000000;
      do {
        lVar10 = (long)__return_storage_ptr__->_currentRow + 1;
        __return_storage_ptr__->_currentRow = (int)lVar10;
        EncodeChar(0x1fea8,0x11,
                   (__return_storage_ptr__->_matrix).
                   super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar10);
        local_88 = (pointer)CONCAT44(local_88._4_4_,uVar16);
        uVar23 = uVar16 % 3;
        iVar17 = (int)local_98;
        iVar15 = (int)local_b0;
        if (uVar23 != 0) {
          iVar17 = (int)local_b0;
          iVar15 = (int)local_60;
          if (uVar23 != 1) {
            iVar17 = (int)local_60;
            iVar15 = (int)local_98;
          }
        }
        local_90 = CONCAT44(local_90._4_4_,iVar17);
        iVar17 = (uVar16 / 3) * 0x20 - ((uint)((ulong)uVar16 * 0xaaaaaaab >> 0x20) & 0xfffffffe);
        EncodeChar(*(int *)(CODEWORD_TABLE + (long)(iVar15 + iVar17) * 4 + (ulong)uVar23 * 0xe84),
                   0x11,(__return_storage_ptr__->_matrix).
                        super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                        __return_storage_ptr__->_currentRow);
        if (0 < (int)local_80) {
          lVar10 = (long)(int)local_a0;
          iVar15 = 0;
          do {
            EncodeChar(*(int *)(CODEWORD_TABLE +
                               (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar10] * 4 +
                               (ulong)uVar23 * 0xe84),0x11,
                       (__return_storage_ptr__->_matrix).
                       super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       __return_storage_ptr__->_currentRow);
            lVar10 = lVar10 + 1;
            iVar15 = iVar15 + -1;
          } while (-iVar12 != iVar15);
          local_a0 = CONCAT44(local_a0._4_4_,(int)local_a0 - iVar15);
          uVar13 = local_b8;
        }
        iVar15 = 1;
        if (bVar1 == false) {
          iVar15 = 0x12;
          EncodeChar(*(int *)(CODEWORD_TABLE +
                             (long)(iVar17 + (int)local_90) * 4 + (ulong)uVar23 * 0xe84),0x11,
                     (__return_storage_ptr__->_matrix).
                     super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                     ._M_impl.super__Vector_impl_data._M_start + __return_storage_ptr__->_currentRow
                    );
        }
        EncodeChar(0x3fa29,iVar15,
                   (__return_storage_ptr__->_matrix).
                   super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                   ._M_impl.super__Vector_impl_data._M_start + __return_storage_ptr__->_currentRow);
        uVar16 = (int)local_88 + 1;
      } while (uVar16 != (uint)uVar13);
    }
    if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar11,"Encoded message contains to many code words, message too big");
  __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BarcodeMatrix
Encoder::generateBarcodeLogic(const std::wstring& msg, int errorCorrectionLevel) const
{
	if (errorCorrectionLevel < 0 || errorCorrectionLevel > 8) {
		throw std::invalid_argument("Error correction level must be between 0 and 8!");
	}

	//1. step: High-level encoding
	int errorCorrectionCodeWords = GetErrorCorrectionCodewordCount(errorCorrectionLevel);
	std::vector<int> highLevel = HighLevelEncoder::EncodeHighLevel(msg, _compaction, _encoding);
	
	int sourceCodeWords = Size(highLevel);

	int cols, rows;
	DetermineDimensions(_minCols, _maxCols, _minRows, _maxRows, sourceCodeWords, errorCorrectionCodeWords, cols, rows);

	int pad = GetNumberOfPadCodewords(sourceCodeWords, errorCorrectionCodeWords, cols, rows);

	//2. step: construct data codewords
	if (sourceCodeWords + errorCorrectionCodeWords + 1 > 929) { // +1 for symbol length CW
		throw std::invalid_argument("Encoded message contains to many code words, message too big");
	}
	int n = sourceCodeWords + pad + 1;
	std::vector<int> dataCodewords;
	dataCodewords.reserve(n);
	dataCodewords.push_back(n);
	dataCodewords.insert(dataCodewords.end(), highLevel.begin(), highLevel.end());
	for (int i = 0; i < pad; i++) {
		dataCodewords.push_back(900); //PAD characters
	}

	//3. step: Error correction
	GenerateErrorCorrection(dataCodewords, errorCorrectionLevel);

	//4. step: low-level encoding
	return EncodeLowLevel(dataCodewords, cols, rows, errorCorrectionLevel, _compact);
}